

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,string_view s)

{
  int iVar1;
  string_view local_28;
  
  local_28 = substr(this,pos1,n1);
  iVar1 = compare(&local_28,s);
  return iVar1;
}

Assistant:

int string_view::compare(size_type pos1, size_type n1, string_view s) const {
  return substr(pos1, n1).compare(s);
}